

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

void Abc_BufPrintOne(Buf_Man_t *p,int iPivot)

{
  Abc_Ntk_t *pNtk;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pObj_00;
  Vec_Int_t *p_00;
  Abc_Obj_t *pFan;
  int local_34;
  int Slack;
  int i;
  Vec_Int_t *vOrder;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  int iPivot_local;
  Buf_Man_t *p_local;
  
  pObj_00 = Abc_NtkObj(p->pNtk,iPivot);
  p_00 = Abc_BufSortByDelay(p,iPivot);
  uVar1 = Abc_ObjFaninNum(pObj_00);
  uVar2 = Abc_ObjFanoutNum(pObj_00);
  uVar3 = Abc_ObjLevel(pObj_00);
  printf("Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {",(ulong)(uint)iPivot,(ulong)uVar1,(ulong)uVar2,
         (ulong)uVar3);
  for (local_34 = 0; iVar4 = Vec_IntSize(p_00), local_34 < iVar4; local_34 = local_34 + 1) {
    pNtk = p->pNtk;
    iVar4 = Vec_IntEntry(p_00,local_34);
    pFan = Abc_NtkObj(pNtk,iVar4);
    if (pFan != (Abc_Obj_t *)0x0) {
      uVar1 = Abc_BufEdgeSlack(p,pObj_00,pFan);
      uVar2 = Abc_ObjId(pFan);
      printf(" %d(%d)",(ulong)uVar2,(ulong)uVar1);
    }
  }
  printf(" }\n");
  return;
}

Assistant:

void Abc_BufPrintOne( Buf_Man_t * p, int iPivot )
{
    Abc_Obj_t * pObj, * pFanout;
    Vec_Int_t * vOrder;
    int i, Slack;
    pObj = Abc_NtkObj( p->pNtk, iPivot );
    vOrder = Abc_BufSortByDelay( p, iPivot );
    printf( "Node %5d  Fi = %d  Fo = %3d  Lev = %3d : {", iPivot, Abc_ObjFaninNum(pObj), Abc_ObjFanoutNum(pObj), Abc_ObjLevel(pObj) );
    Abc_NtkForEachObjVec( vOrder, p->pNtk, pFanout, i )
    {
        Slack = Abc_BufEdgeSlack( p, pObj, pFanout );
        printf( " %d(%d)", Abc_ObjId(pFanout), Slack );
    }
    printf( " }\n" );
}